

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StandardLibrary.h
# Opt level: O1

CodeLocation soul::getSystemModule(string_view moduleName)

{
  char *__s;
  size_t sVar1;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  UTF8Reader UVar2;
  Ptr this;
  CodeLocation CVar3;
  string_view moduleName_00;
  Ptr local_70;
  string local_68;
  string local_48;
  
  this.object = (SourceCodeText *)moduleName._M_len;
  moduleName_00._M_str = in_RDX;
  moduleName_00._M_len = (size_t)in_RDX;
  __s = getSystemModuleCode((soul *)moduleName._M_str,moduleName_00);
  UVar2.data = extraout_RDX;
  if (__s != (char *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar1);
    SourceCodeText::createInternal((SourceCodeText *)&local_70,&local_48,&local_68);
    CodeLocation::CodeLocation((CodeLocation *)this.object,&local_70);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.object);
    UVar2.data = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      UVar2.data = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      UVar2.data = extraout_RDX_02;
    }
    if (__s != (char *)0x0) goto LAB_001c47e9;
  }
  *(undefined8 *)this.object = 0;
  ((this.object)->filename)._M_dataplus._M_p = (char *)0x0;
LAB_001c47e9:
  CVar3.location.data = UVar2.data;
  CVar3.sourceCode.object = this.object;
  return CVar3;
}

Assistant:

inline CodeLocation getSystemModule (std::string_view moduleName)
{
    if (auto code = getSystemModuleCode (moduleName))
        return SourceCodeText::createInternal (std::string (moduleName), code);

    return {};
}